

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall ThreadPool::stop(ThreadPool *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer ptVar3;
  
  clear(this);
  if ((this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::mutex::lock(&this->_taskInfo);
    puVar1 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (puVar2 = (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
      *puVar2 = '\x01';
    }
    puVar1 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar2 = (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
      *puVar2 = '\x01';
    }
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
    for (ptVar3 = (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ptVar3 != (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                  _M_impl.super__Vector_impl_data._M_finish; ptVar3 = ptVar3 + 1) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear(&this->_worker);
    return;
  }
  return;
}

Assistant:

void ThreadPool::stop()
{
    clear();

    if( !_worker.empty() ) {
        _taskInfo.lock();

        std::fill( _exit.begin(), _exit.end(), 1 );
        std::fill( _run.begin(), _run.end(), 1 );
        _waiting.notify_all();

        _taskInfo.unlock();

        for( std::vector < std::thread >::iterator thread = _worker.begin(); thread != _worker.end(); ++thread )
            thread->join();

        _worker.clear();
    }
}